

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_ManMemUsageUseful(Au_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int i;
  
  iVar2 = 0;
  for (i = 1; i < (p->vNtks).nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(&p->vNtks,i);
    iVar2 = iVar2 + *(int *)((long)pvVar1 + 0x88) * 0x10;
  }
  return iVar2;
}

Assistant:

int Au_ManMemUsageUseful( Au_Man_t * p )
{
    Au_Ntk_t * pNtk;
    int i, Mem = 0;
    Au_ManForEachNtk( p, pNtk, i )
        Mem += 16 * pNtk->nObjsUsed;
    return Mem;
}